

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

Gia_Obj_t * Gia_ObjRecognizeMux(Gia_Obj_t *pNode,Gia_Obj_t **ppNodeT,Gia_Obj_t **ppNodeE)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  int iVar7;
  Gia_Obj_t *pGVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Gia_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x3c2,"Gia_Obj_t *Gia_ObjRecognizeMux(Gia_Obj_t *, Gia_Obj_t **, Gia_Obj_t **)");
  }
  iVar7 = Gia_ObjIsMuxType(pNode);
  if (iVar7 == 0) {
    __assert_fail("Gia_ObjIsMuxType(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x3c3,"Gia_Obj_t *Gia_ObjRecognizeMux(Gia_Obj_t *, Gia_Obj_t **, Gia_Obj_t **)");
  }
  pGVar8 = pNode + -(*(ulong *)pNode & 0x1fffffff);
  pGVar1 = pNode + -(*(ulong *)pNode >> 0x20 & 0x1fffffff);
  uVar10 = *(ulong *)pGVar8;
  pGVar2 = pGVar8 + -(uVar10 >> 0x20 & 0x1fffffff);
  uVar6 = *(ulong *)pGVar1;
  pGVar3 = pGVar1 + -(uVar6 >> 0x20 & 0x1fffffff);
  uVar9 = (uint)uVar6;
  uVar11 = (uint)(uVar10 >> 0x20);
  if ((pGVar2 == pGVar3) && (uVar12 = uVar11 >> 0x1d & 1, uVar12 != ((uVar6 >> 0x3d & 1) != 0))) {
    if (uVar12 == 0) {
      *ppNodeT = (Gia_Obj_t *)
                 (((ulong)((uint)uVar10 >> 0x1d & 1) | (ulong)(pGVar8 + -(uVar10 & 0x1fffffff))) ^ 1
                 );
      *ppNodeE = (Gia_Obj_t *)
                 (((ulong)((uint)(*(ulong *)pGVar1 >> 0x1d) & 1) |
                  (ulong)(pGVar1 + -(*(ulong *)pGVar1 & 0x1fffffff))) ^ 1);
      uVar10 = *(ulong *)pGVar8;
LAB_0078fb53:
      uVar11 = (uint)(uVar10 >> 0x20);
      pGVar8 = pGVar8 + -(uVar10 >> 0x20 & 0x1fffffff);
    }
    else {
      *ppNodeT = (Gia_Obj_t *)
                 (((ulong)(uVar9 >> 0x1d & 1) | (ulong)(pGVar1 + -(uVar6 & 0x1fffffff))) ^ 1);
      uVar10 = *(ulong *)pGVar8;
      uVar11 = (uint)(uVar10 >> 0x1d) & 7;
LAB_0078fcdc:
      *ppNodeE = (Gia_Obj_t *)(((ulong)(uVar11 & 1) | (ulong)(pGVar8 + -(uVar10 & 0x1fffffff))) ^ 1)
      ;
      uVar11 = (uint)(*(ulong *)pGVar1 >> 0x20);
      pGVar8 = pGVar1 + -(*(ulong *)pGVar1 >> 0x20 & 0x1fffffff);
    }
    uVar11 = uVar11 >> 0x1d;
    goto LAB_0078fd05;
  }
  pGVar4 = pGVar8 + -(uVar10 & 0x1fffffff);
  pGVar5 = pGVar1 + -(uVar6 & 0x1fffffff);
  uVar12 = (uint)(uVar6 >> 0x20);
  if ((pGVar4 == pGVar5) && (((uint)(uVar10 >> 0x1d) & 1) != (uint)((uVar9 >> 0x1d & 1) != 0))) {
    if ((uVar10 >> 0x1d & 1) == 0) {
      *ppNodeT = (Gia_Obj_t *)(((ulong)(uVar11 >> 0x1d & 1) | (ulong)pGVar2) ^ 1);
      *ppNodeE = (Gia_Obj_t *)
                 (((ulong)((uint)(*(ulong *)pGVar1 >> 0x3d) & 1) |
                  (ulong)(pGVar1 + -(*(ulong *)pGVar1 >> 0x20 & 0x1fffffff))) ^ 1);
      uVar10 = *(ulong *)pGVar8;
      goto LAB_0078fc0a;
    }
    *ppNodeT = (Gia_Obj_t *)(((ulong)(uVar12 >> 0x1d & 1) | (ulong)pGVar3) ^ 1);
    *ppNodeE = (Gia_Obj_t *)
               (((ulong)((uint)(*(ulong *)pGVar8 >> 0x3d) & 1) |
                (ulong)(pGVar8 + -(*(ulong *)pGVar8 >> 0x20 & 0x1fffffff))) ^ 1);
    uVar10 = *(ulong *)pGVar1;
LAB_0078fca1:
    pGVar8 = pGVar1 + -(uVar10 & 0x1fffffff);
  }
  else {
    if ((pGVar4 != pGVar3) || (((uint)(uVar10 >> 0x1d) & 1) == (uint)((uVar6 >> 0x3d & 1) != 0))) {
      if ((pGVar2 != pGVar5) || (uVar11 = uVar11 >> 0x1d & 1, uVar11 == ((uVar9 >> 0x1d & 1) != 0)))
      {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                      ,0x409,
                      "Gia_Obj_t *Gia_ObjRecognizeMux(Gia_Obj_t *, Gia_Obj_t **, Gia_Obj_t **)");
      }
      if (uVar11 == 0) {
        *ppNodeT = (Gia_Obj_t *)(((ulong)((uint)uVar10 >> 0x1d & 1) | (ulong)pGVar4) ^ 1);
        *ppNodeE = (Gia_Obj_t *)
                   (((ulong)((uint)(*(ulong *)pGVar1 >> 0x3d) & 1) |
                    (ulong)(pGVar1 + -(*(ulong *)pGVar1 >> 0x20 & 0x1fffffff))) ^ 1);
        uVar10 = *(ulong *)pGVar8;
        goto LAB_0078fb53;
      }
      *ppNodeT = (Gia_Obj_t *)(((ulong)(uVar12 >> 0x1d & 1) | (ulong)pGVar3) ^ 1);
      *ppNodeE = (Gia_Obj_t *)
                 (((ulong)((uint)(*(ulong *)pGVar8 >> 0x1d) & 1) |
                  (ulong)(pGVar8 + -(*(ulong *)pGVar8 & 0x1fffffff))) ^ 1);
      uVar10 = *(ulong *)pGVar1;
      goto LAB_0078fca1;
    }
    if ((uVar10 >> 0x1d & 1) != 0) {
      *ppNodeT = (Gia_Obj_t *)(((ulong)(uVar9 >> 0x1d & 1) | (ulong)pGVar5) ^ 1);
      uVar10 = *(ulong *)pGVar8 >> 0x20;
      uVar11 = (uint)(*(ulong *)pGVar8 >> 0x3d);
      goto LAB_0078fcdc;
    }
    *ppNodeT = (Gia_Obj_t *)(((ulong)(uVar11 >> 0x1d & 1) | (ulong)pGVar2) ^ 1);
    *ppNodeE = (Gia_Obj_t *)
               (((ulong)((uint)(*(ulong *)pGVar1 >> 0x1d) & 1) |
                (ulong)(pGVar1 + -(*(ulong *)pGVar1 & 0x1fffffff))) ^ 1);
    uVar10 = *(ulong *)pGVar8;
LAB_0078fc0a:
    pGVar8 = pGVar8 + -(uVar10 & 0x1fffffff);
  }
  uVar11 = (uint)(uVar10 >> 0x1d);
LAB_0078fd05:
  return (Gia_Obj_t *)((ulong)(uVar11 & 1) | (ulong)pGVar8);
}

Assistant:

Gia_Obj_t * Gia_ObjRecognizeMux( Gia_Obj_t * pNode, Gia_Obj_t ** ppNodeT, Gia_Obj_t ** ppNodeE )
{
    Gia_Obj_t * pNode0, * pNode1;
    assert( !Gia_IsComplement(pNode) );
    assert( Gia_ObjIsMuxType(pNode) );
    // get children
    pNode0 = Gia_ObjFanin0(pNode);
    pNode1 = Gia_ObjFanin1(pNode);

    // find the control variable
    if ( Gia_ObjFanin1(pNode0) == Gia_ObjFanin1(pNode1) && (Gia_ObjFaninC1(pNode0) ^ Gia_ObjFaninC1(pNode1)) )
    {
//        if ( FrGia_IsComplement(pNode1->p2) )
        if ( Gia_ObjFaninC1(pNode0) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Gia_Not(Gia_ObjChild0(pNode1));//pNode2->p1);
            *ppNodeE = Gia_Not(Gia_ObjChild0(pNode0));//pNode1->p1);
            return Gia_ObjChild1(pNode1);//pNode2->p2;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Gia_Not(Gia_ObjChild0(pNode0));//pNode1->p1);
            *ppNodeE = Gia_Not(Gia_ObjChild0(pNode1));//pNode2->p1);
            return Gia_ObjChild1(pNode0);//pNode1->p2;
        }
    }
    else if ( Gia_ObjFanin0(pNode0) == Gia_ObjFanin0(pNode1) && (Gia_ObjFaninC0(pNode0) ^ Gia_ObjFaninC0(pNode1)) )
    {
//        if ( FrGia_IsComplement(pNode1->p1) )
        if ( Gia_ObjFaninC0(pNode0) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Gia_Not(Gia_ObjChild1(pNode1));//pNode2->p2);
            *ppNodeE = Gia_Not(Gia_ObjChild1(pNode0));//pNode1->p2);
            return Gia_ObjChild0(pNode1);//pNode2->p1;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Gia_Not(Gia_ObjChild1(pNode0));//pNode1->p2);
            *ppNodeE = Gia_Not(Gia_ObjChild1(pNode1));//pNode2->p2);
            return Gia_ObjChild0(pNode0);//pNode1->p1;
        }
    }
    else if ( Gia_ObjFanin0(pNode0) == Gia_ObjFanin1(pNode1) && (Gia_ObjFaninC0(pNode0) ^ Gia_ObjFaninC1(pNode1)) )
    {
//        if ( FrGia_IsComplement(pNode1->p1) )
        if ( Gia_ObjFaninC0(pNode0) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Gia_Not(Gia_ObjChild0(pNode1));//pNode2->p1);
            *ppNodeE = Gia_Not(Gia_ObjChild1(pNode0));//pNode1->p2);
            return Gia_ObjChild1(pNode1);//pNode2->p2;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Gia_Not(Gia_ObjChild1(pNode0));//pNode1->p2);
            *ppNodeE = Gia_Not(Gia_ObjChild0(pNode1));//pNode2->p1);
            return Gia_ObjChild0(pNode0);//pNode1->p1;
        }
    }
    else if ( Gia_ObjFanin1(pNode0) == Gia_ObjFanin0(pNode1) && (Gia_ObjFaninC1(pNode0) ^ Gia_ObjFaninC0(pNode1)) )
    {
//        if ( FrGia_IsComplement(pNode1->p2) )
        if ( Gia_ObjFaninC1(pNode0) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Gia_Not(Gia_ObjChild1(pNode1));//pNode2->p2);
            *ppNodeE = Gia_Not(Gia_ObjChild0(pNode0));//pNode1->p1);
            return Gia_ObjChild0(pNode1);//pNode2->p1;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Gia_Not(Gia_ObjChild0(pNode0));//pNode1->p1);
            *ppNodeE = Gia_Not(Gia_ObjChild1(pNode1));//pNode2->p2);
            return Gia_ObjChild1(pNode0);//pNode1->p2;
        }
    }
    assert( 0 ); // this is not MUX
    return NULL;
}